

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

void duckdb_je_arena_dalloc_small(tsdn_t *tsdn,void *ptr)

{
  _Bool _Var1;
  arena_t *tsdn_00;
  edata_t *in_RSI;
  long in_RDI;
  arena_t *arena;
  edata_t *edata;
  rtree_ctx_t *rtree_ctx;
  rtree_ctx_t rtree_ctx_fallback;
  uint8_t state;
  uint64_t *prng_state;
  ticker_geom_t *decay_ticker;
  tsd_t *tsd;
  uint8_t state_2;
  uint8_t state_1;
  uint8_t state_3;
  undefined4 in_stack_fffffffffffffd18;
  int32_t in_stack_fffffffffffffd1c;
  ticker_geom_t *in_stack_fffffffffffffd40;
  rtree_ctx_t *in_stack_fffffffffffffd48;
  rtree_t *in_stack_fffffffffffffd50;
  atomic_u_t in_stack_fffffffffffffd60 [2];
  arena_t *local_e8;
  
  local_e8 = (arena_t *)&stack0xfffffffffffffd60;
  if (in_RDI == 0) {
    duckdb_je_rtree_ctx_data_init((rtree_ctx_t *)local_e8);
  }
  else {
    local_e8 = (arena_t *)(in_RDI + 0x1b8);
  }
  rtree_read((tsdn_t *)local_e8,in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
             (uintptr_t)in_stack_fffffffffffffd40);
  tsdn_00 = arena_get_from_edata(in_RSI);
  arena_dalloc_bin((tsdn_t *)in_stack_fffffffffffffd60,local_e8,(edata_t *)in_stack_fffffffffffffd50
                   ,in_stack_fffffffffffffd48);
  if ((in_RDI != 0) &&
     (_Var1 = ticker_geom_ticks(in_stack_fffffffffffffd40,(uint64_t *)tsdn_00,
                                in_stack_fffffffffffffd1c,
                                SUB41((uint)in_stack_fffffffffffffd18 >> 0x18,0)), _Var1)) {
    duckdb_je_arena_decay
              ((tsdn_t *)tsdn_00,
               (arena_t *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),false,false)
    ;
  }
  return;
}

Assistant:

void
arena_dalloc_small(tsdn_t *tsdn, void *ptr) {
	edata_t *edata = emap_edata_lookup(tsdn, &arena_emap_global, ptr);
	arena_t *arena = arena_get_from_edata(edata);

	arena_dalloc_bin(tsdn, arena, edata, ptr);
	arena_decay_tick(tsdn, arena);
}